

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  ulonglong uVar8;
  undefined8 uVar9;
  long lVar10;
  int __oflag;
  undefined1 local_148 [8];
  tlc_string_t errstr_1;
  tlc_linecount_t tStack_120;
  tlc_error_t err_1;
  tlc_linecount_t count;
  undefined1 local_110 [8];
  tlc_string_t errstr;
  tlc_error_t err;
  undefined1 local_e0 [8];
  CLineCount lc;
  char *endptr;
  char *lastchar;
  size_t multiplier;
  char *wsstr;
  char *filename;
  PARAMETERS params;
  int posparam;
  int arg;
  char **argv_local;
  int argc_local;
  
  params._12_4_ = 1;
  params.threadcount = 0;
  filename = (char *)0xffffffffffffffff;
  params.buffersize._0_4_ = -1;
  wsstr = (char *)0x0;
  if (argc == 1) {
    help(*argv);
    exit(0);
  }
  do {
    if (argc <= (int)params._12_4_) {
      if (params.threadcount == 1) {
        TURBOLINECOUNT::CLineCount::CLineCount((CLineCount *)local_e0,(PARAMETERS *)&filename);
        uVar5 = TURBOLINECOUNT::CLineCount::open((CLineCount *)local_e0,wsstr,__oflag);
        if ((uVar5 & 1) == 0) {
          errstr.field_2._8_4_ = TURBOLINECOUNT::CLineCount::lastError((CLineCount *)local_e0);
          TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_
                    ((tlc_string_t *)local_110,(CLineCount *)local_e0);
          uVar2 = errstr.field_2._8_4_;
          pFVar1 = _stderr;
          pcVar7 = *argv;
          uVar9 = std::__cxx11::string::c_str();
          fprintf(pFVar1,"%s: Error %d (%s)\n",pcVar7,(ulong)(uint)uVar2,uVar9);
          argv_local._4_4_ = errstr.field_2._8_4_;
          count._4_4_ = 1;
          std::__cxx11::string::~string((string *)local_110);
        }
        else {
          bVar3 = TURBOLINECOUNT::CLineCount::countLines
                            ((CLineCount *)local_e0,&stack0xfffffffffffffee0);
          if (bVar3) {
            printf("%ld\n",tStack_120);
            argv_local._4_4_ = 0;
            count._4_4_ = 1;
          }
          else {
            errstr_1.field_2._12_4_ = TURBOLINECOUNT::CLineCount::lastError((CLineCount *)local_e0);
            TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_
                      ((tlc_string_t *)local_148,(CLineCount *)local_e0);
            uVar2 = errstr_1.field_2._12_4_;
            pFVar1 = _stderr;
            pcVar7 = *argv;
            uVar9 = std::__cxx11::string::c_str();
            fprintf(pFVar1,"%s: Error %d: (%s)\n",pcVar7,(ulong)(uint)uVar2,uVar9);
            argv_local._4_4_ = errstr_1.field_2._12_4_;
            count._4_4_ = 1;
            std::__cxx11::string::~string((string *)local_148);
          }
        }
        TURBOLINECOUNT::CLineCount::~CLineCount((CLineCount *)local_e0);
      }
      else {
        fprintf(_stderr,"%s: Missing required argument\n",*argv);
        argv_local._4_4_ = 1;
      }
      return argv_local._4_4_;
    }
    iVar4 = strcmp(argv[(int)params._12_4_],"-h");
    if ((iVar4 == 0) || (iVar4 = strcmp(argv[(int)params._12_4_],"--help"), iVar4 == 0)) {
      help(*argv);
      exit(0);
    }
    iVar4 = strcmp(argv[(int)params._12_4_],"-v");
    if ((iVar4 == 0) || (iVar4 = strcmp(argv[(int)params._12_4_],"--version"), iVar4 == 0)) {
      version();
      exit(0);
    }
    iVar4 = strcmp(argv[(int)params._12_4_],"-b");
    if ((iVar4 == 0) || (iVar4 = strcmp(argv[(int)params._12_4_],"--buffersize"), iVar4 == 0)) {
      iVar4 = params._12_4_ + 1;
      if (iVar4 == argc) {
        lVar10 = (long)(int)params._12_4_;
        params._12_4_ = iVar4;
        fprintf(_stderr,"%s: missing argument to %s\n",*argv,argv[lVar10]);
        return 1;
      }
      pcVar7 = argv[iVar4];
      lastchar = (char *)0x1;
      params._12_4_ = iVar4;
      sVar6 = strlen(pcVar7);
      pcVar7 = pcVar7 + (sVar6 - 1);
      if ((*pcVar7 == 'k') || (*pcVar7 == 'K')) {
        lastchar = (char *)0x400;
      }
      else if ((*pcVar7 == 'm') || (*pcVar7 == 'M')) {
        lastchar = "\x7fELF\x02\x01\x01";
      }
      else if ((*pcVar7 == 'g') || (*pcVar7 == 'G')) {
        lastchar = (char *)0x40000000;
      }
      uVar8 = strtoull(argv[(int)params._12_4_],(char **)&lc.m_thread_fail,10);
      filename = (char *)(uVar8 * (long)lastchar);
    }
    else {
      iVar4 = strcmp(argv[(int)params._12_4_],"-t");
      if ((iVar4 == 0) || (iVar4 = strcmp(argv[(int)params._12_4_],"--threadcount"), iVar4 == 0)) {
        iVar4 = params._12_4_ + 1;
        if (iVar4 == argc) {
          lVar10 = (long)(int)params._12_4_;
          params._12_4_ = iVar4;
          fprintf(_stderr,"%s: Missing argument to %s\n",*argv,argv[lVar10]);
          return 1;
        }
        params._12_4_ = iVar4;
        params.buffersize._0_4_ = atoi(argv[iVar4]);
        if ((int)params.buffersize < 1) {
          fprintf(_stderr,"%s: Invalid thread count\n",*argv);
          return 1;
        }
      }
      else {
        if (params.threadcount != 0) {
          fprintf(_stderr,"%s: Too many arguments\n",*argv);
          return 1;
        }
        wsstr = argv[(int)params._12_4_];
        params.threadcount = 1;
      }
    }
    params._12_4_ = params._12_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
#endif
{
	// Parse parameters
	int arg = 1;
	int posparam = 0;
	
	CLineCount::PARAMETERS params;
	params.buffersize = -1;
	params.threadcount = -1;

	TCHAR *filename = NULL;

	if(argc==1)
	{
		help(argv[0]);
		exit(0);
	}

	while (arg < argc)
	{
		if (_tcscmp(argv[arg], _T("-h")) == 0 || _tcscmp(argv[arg], _T("--help")) == 0) 
		{
			help(argv[0]);
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-v")) == 0 || _tcscmp(argv[arg], _T("--version")) == 0) 
		{
			version();
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-b")) == 0 || _tcscmp(argv[arg], _T("--buffersize")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			TCHAR *wsstr = argv[arg];

			// Check for size multipliers			
			size_t multiplier = 1;
			TCHAR *lastchar = wsstr + (_tcslen(wsstr) - 1);
			if (*lastchar == _T('k') || *lastchar == _T('K'))
			{
				multiplier = 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('m') || *lastchar == _T('M'))
			{
				multiplier = 1024 * 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('g') || *lastchar == _T('G'))
			{
				multiplier = 1024 * 1024 * 1024;
				lastchar = 0;
			}

			TCHAR *endptr;
			params.buffersize = ((size_t)_tcstoui64(argv[arg], &endptr, 10)) * multiplier;

		}
		else if (_tcscmp(argv[arg], _T("-t")) == 0 || _tcscmp(argv[arg], _T("--threadcount")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: Missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			params.threadcount = _ttoi(argv[arg]);
			if(params.threadcount<=0)
			{
				_ftprintf(stderr, _T("%s: Invalid thread count\n"), argv[0]);
				return 1;
			}
		}
		else
		{
			if (posparam == 0)
			{
				filename = argv[arg];
			}
			else
			{
				_ftprintf(stderr, _T("%s: Too many arguments\n"), argv[0]);
				return 1;
			}
			posparam++;
		}

		arg++;
	}

	if (posparam != 1)
	{
		_ftprintf(stderr, _T("%s: Missing required argument\n"), argv[0]);
		return 1;
	}
	
	// Create line count class
	CLineCount lc(&params);

	if (!lc.open(filename))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Count lines
	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d: (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Display output
	_tprintf(_T(TLC_LINECOUNT_FMT) _T("\n"), count);
	
	return 0;
}